

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_raw<std::vector<short,std::allocator<short>>>
          (Simplex_tree<MiniSTOptions> *this,vector<short,_std::allocator<short>_> *simplex,
          Filtration_value *filtration)

{
  short sVar1;
  short sVar2;
  undefined8 *puVar3;
  uint uVar4;
  pointer *ppsVar5;
  ulong uVar6;
  short *psVar7;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar8;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar9;
  __buckets_ptr local_40;
  char local_38;
  
  ppsVar5 = &simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  psVar7 = (short *)*filtration;
  while( true ) {
    sVar1 = *psVar7;
    sVar2 = *(short *)&simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish;
    if (psVar7 == (short *)((long)filtration[1] + -2)) break;
    if (sVar1 == sVar2) goto LAB_0011620c;
    insert_node_<false,true,false,double_const&>
              ((Simplex_tree<MiniSTOptions> *)&stack0xffffffffffffffc0,(Siblings *)simplex,
               (Vertex_handle)ppsVar5,(double *)(ulong)(uint)(int)sVar1);
    ppsVar5 = (pointer *)local_40[2];
    psVar7 = psVar7 + 1;
  }
  if (sVar1 != sVar2) {
    pVar8 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<MiniSTOptions> *)&stack0xffffffffffffffc0,(Siblings *)simplex,
                       (Vertex_handle)ppsVar5,(double *)(ulong)(uint)(int)sVar1);
    uVar6 = pVar8._8_8_;
    if (local_38 == '\x01') {
      uVar4 = (int)((ulong)((long)filtration[1] - (long)*filtration) >> 1) - 1;
      uVar6 = (ulong)uVar4;
      if (*(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish < (int)uVar4) {
        *(uint *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish = uVar4;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar9._8_8_ = uVar6;
    pVar9.first.m_ptr =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
          *)this;
    return pVar9;
  }
LAB_0011620c:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }